

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O3

int array_run_container_intersection_cardinality(array_container_t *src_1,run_container_t *src_2)

{
  int iVar1;
  int iVar2;
  rle16_t *prVar3;
  uint16_t *puVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ushort uVar13;
  uint uVar14;
  uint16_t *puVar15;
  int iVar16;
  uint uVar17;
  
  iVar1 = src_2->n_runs;
  prVar3 = src_2->runs;
  uVar10 = (uint)prVar3->value;
  if (prVar3->value == 0 && iVar1 == 1) {
    if (prVar3->length == 0xffff) {
      return src_1->cardinality;
    }
  }
  else if (iVar1 == 0) {
    return 0;
  }
  iVar2 = src_1->cardinality;
  if (iVar2 < 1) {
    return 0;
  }
  uVar11 = (uint)prVar3->length;
  puVar4 = src_1->array;
  iVar6 = 0;
  uVar7 = 0;
  iVar12 = 0;
  do {
    uVar13 = puVar4[(int)uVar7];
    if (uVar11 + uVar10 < (uint)uVar13) {
      puVar15 = &prVar3[(long)iVar12 + 1].length;
      do {
        if (iVar1 + -1 == iVar12) {
          return iVar6;
        }
        uVar10 = (uint)((rle16_t *)(puVar15 + -1))->value;
        uVar11 = (uint)*puVar15;
        puVar15 = puVar15 + 2;
        iVar12 = iVar12 + 1;
      } while (uVar10 + uVar11 < (uint)uVar13);
    }
    uVar9 = (ushort)uVar10;
    if (uVar13 < uVar9) {
      uVar17 = uVar7 + 1;
      uVar14 = uVar17;
      if (((int)uVar17 < iVar2) && (puVar4[(int)uVar17] < uVar9)) {
        uVar7 = uVar7 + 2;
        iVar8 = 1;
        if ((int)uVar7 < iVar2) {
          iVar16 = 1;
          do {
            uVar13 = puVar4[(int)uVar7];
            iVar8 = iVar16;
            if (uVar9 <= uVar13) goto LAB_0011daac;
            iVar8 = iVar16 * 2;
            uVar7 = uVar17 + iVar16 * 2;
            iVar16 = iVar8;
          } while ((int)uVar7 < iVar2);
        }
        uVar13 = puVar4[iVar2 - 1U];
        uVar7 = iVar2 - 1U;
LAB_0011daac:
        uVar14 = uVar7;
        if (uVar13 != uVar9) {
          if (uVar13 < uVar9) {
            return iVar6;
          }
          if ((iVar8 >> 1) + uVar17 + 1 != uVar7) {
            uVar17 = (iVar8 >> 1) + uVar17;
            do {
              uVar14 = (int)(uVar17 + uVar7) >> 1;
              if (puVar4[(int)uVar14] == uVar9) break;
              uVar5 = uVar14;
              if (uVar9 <= puVar4[(int)uVar14]) {
                uVar5 = uVar17;
                uVar7 = uVar14;
              }
              uVar17 = uVar5;
              uVar14 = uVar7;
            } while (uVar17 + 1 != uVar7);
          }
        }
      }
    }
    else {
      iVar6 = iVar6 + 1;
      uVar14 = uVar7 + 1;
    }
    uVar7 = uVar14;
    if (iVar2 <= (int)uVar7) {
      return iVar6;
    }
  } while( true );
}

Assistant:

int array_run_container_intersection_cardinality(const array_container_t *src_1,
                                                 const run_container_t *src_2) {
    if (run_container_is_full(src_2)) {
        return src_1->cardinality;
    }
    if (src_2->n_runs == 0) {
        return 0;
    }
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t rle = src_2->runs[rlepos];
    int32_t newcard = 0;
    while (arraypos < src_1->cardinality) {
        const uint16_t arrayval = src_1->array[arraypos];
        while (rle.value + rle.length <
               arrayval) {  // this will frequently be false
            ++rlepos;
            if (rlepos == src_2->n_runs) {
                return newcard;  // we are done
            }
            rle = src_2->runs[rlepos];
        }
        if (rle.value > arrayval) {
            arraypos = advanceUntil(src_1->array, arraypos, src_1->cardinality,
                                    rle.value);
        } else {
            newcard++;
            arraypos++;
        }
    }
    return newcard;
}